

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O1

future<void> * __thiscall
mxx::comm::isend<int>
          (future<void> *__return_storage_ptr__,comm *this,int *msg,size_t size,int dest,int tag)

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  MPI_Request *ppoVar3;
  datatype dt;
  future_builder<void> f;
  datatype local_98;
  datatype local_80;
  uint local_68 [2];
  future_base<void> local_60;
  
  if ((dest < 0) || (this->m_size <= dest)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,local_68);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_68[0],
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
           ,0x151,"isend","0 <= dest && dest < this->size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_68[0] = CONCAT31(local_68[0]._1_3_,1);
  local_60.m_valid = false;
  local_60.m_ever_valid = false;
  local_60.m_req._vptr_requests = (_func_int **)&PTR__requests_001a5d90;
  local_60.m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._vptr_future_base = (_func_int **)&PTR__future_base_001a6c60;
  if (size < 0x7fffffff) {
    local_98._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
    local_98.mpitype = (MPI_Datatype)&ompi_mpi_int;
    local_98.builtin = true;
    poVar1 = this->mpi_comm;
    ppoVar3 = requests::add(&local_60.m_req);
    MPI_Isend(msg,size & 0xffffffff,&ompi_mpi_int,dest,tag,poVar1,ppoVar3);
  }
  else {
    local_80._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
    local_80.mpitype = (MPI_Datatype)&ompi_mpi_int;
    local_80.builtin = true;
    datatype::contiguous(&local_98,&local_80,size);
    datatype::~datatype(&local_80);
    poVar2 = local_98.mpitype;
    poVar1 = this->mpi_comm;
    ppoVar3 = requests::add(&local_60.m_req);
    MPI_Isend(msg,1,poVar2,dest,tag,poVar1,ppoVar3);
  }
  datatype::~datatype(&local_98);
  local_68[0] = local_68[0] & 0xffffff00;
  (__return_storage_ptr__->super_future_base<void>)._vptr_future_base =
       (_func_int **)&PTR__future_base_001a6b60;
  (__return_storage_ptr__->super_future_base<void>).m_valid = local_60.m_valid;
  (__return_storage_ptr__->super_future_base<void>).m_ever_valid = local_60.m_ever_valid;
  (__return_storage_ptr__->super_future_base<void>).m_req._vptr_requests =
       (_func_int **)&PTR__requests_001a5d90;
  (__return_storage_ptr__->super_future_base<void>).m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_60.m_req.m_requests.
       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super_future_base<void>).m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_60.m_req.m_requests.
       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super_future_base<void>).m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_60.m_req.m_requests.
       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_60.m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_future_base<void>)._vptr_future_base =
       (_func_int **)&PTR__future_base_001a6c60;
  impl::future_base<void>::~future_base(&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<void> isend(const T* msg, size_t size, int dest, int tag = 0) const {
        MXX_ASSERT(0 <= dest && dest < this->size());
        mxx::future_builder<void> f;
        if (size < mxx::max_int) {
            mxx::datatype dt = mxx::get_datatype<T>();
            MPI_Isend(const_cast<T*>(msg), size, dt.type(), dest, tag, this->mpi_comm, &f.add_request());
        } else {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
            MPI_Isend(const_cast<T*>(msg), 1, dt.type(), dest, tag, this->mpi_comm, &f.add_request());
        }
        return f.get_future();
    }